

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int extra_setup_location(isoent *isoent,int location)

{
  int cnt;
  extr_rec *rec;
  int location_local;
  isoent *isoent_local;
  
  cnt = 0;
  rec = (isoent->extr_rec_list).first;
  (isoent->extr_rec_list).current = rec;
  location_local = location;
  for (; rec != (extr_rec *)0x0; rec = rec->next) {
    cnt = cnt + 1;
    rec->location = location_local;
    rec->offset = 0;
    location_local = location_local + 1;
  }
  return cnt;
}

Assistant:

static int
extra_setup_location(struct isoent *isoent, int location)
{
	struct extr_rec *rec;
	int cnt;

	cnt = 0;
	rec = isoent->extr_rec_list.first;
	isoent->extr_rec_list.current = rec;
	while (rec) {
		cnt++;
		rec->location = location++;
		rec->offset = 0;
		rec = rec->next;
	}
	return (cnt);
}